

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *
GetRandomNodeEvictionCandidates
          (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
           *__return_storage_ptr__,int n_candidates,FastRandomContext *random_context)

{
  iterator __position;
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  NodeEvictionCandidate *pNVar6;
  iterator iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  byte bVar9;
  NodeEvictionCandidate local_80;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::reserve
            (__return_storage_ptr__,(long)n_candidates);
  if (0 < n_candidates) {
    uVar8 = 0;
    uVar4 = (ulong)(uint)n_candidates;
    uVar2 = uVar8;
    do {
      do {
        local_80.id = uVar2;
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,7);
        uVar1 = uVar4;
        if (99 >= uVar3) {
          uVar1 = uVar3;
        }
        uVar4 = uVar1 & 0xffffffff;
        uVar2 = local_80.id;
      } while (99 < uVar3);
      local_80.m_connected.__r = (rep)(int)uVar1;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,7);
      } while (99 < uVar3);
      local_80.m_min_ping_time.__r = (rep)(int)uVar3;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,7);
      } while (99 < uVar3);
      local_80.m_last_block_time.__r = (rep)(int)uVar3;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,7);
      } while (99 < uVar3);
      local_80.m_last_tx_time.__r = (rep)(int)uVar3;
      uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                        (&random_context->super_RandomMixin<FastRandomContext>);
      local_80.fRelevantServices = uVar3 != 0;
      uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                        (&random_context->super_RandomMixin<FastRandomContext>);
      local_80.m_relay_txs = uVar3 != 0;
      uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                        (&random_context->super_RandomMixin<FastRandomContext>);
      local_80.fBloomFilter = uVar3 != 0;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,7);
      } while (99 < uVar3);
      local_80.nKeyedNetGroup = uVar3 & 0xffffffff;
      uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                        (&random_context->super_RandomMixin<FastRandomContext>);
      local_80.prefer_evict = uVar3 != 0;
      uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                        (&random_context->super_RandomMixin<FastRandomContext>);
      local_80.m_is_local = uVar3 != 0;
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&random_context->super_RandomMixin<FastRandomContext>,3);
      } while (6 < uVar4);
      local_80.m_network = ALL_NETWORKS._M_elems[uVar4];
      local_80.m_noban = false;
      local_80.m_conn_type = INBOUND;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::
        _M_realloc_insert<NodeEvictionCandidate>(__return_storage_ptr__,__position,&local_80);
      }
      else {
        pNVar6 = &local_80;
        iVar7._M_current = __position._M_current;
        for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
          (iVar7._M_current)->id = pNVar6->id;
          pNVar6 = (NodeEvictionCandidate *)((long)pNVar6 + (ulong)bVar9 * -0x10 + 8);
          iVar7._M_current = iVar7._M_current + (ulong)bVar9 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar8 = uVar8 + 1;
      uVar2 = uVar8;
    } while (uVar8 != (uint)n_candidates);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<NodeEvictionCandidate> GetRandomNodeEvictionCandidates(int n_candidates, FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates;
    candidates.reserve(n_candidates);
    for (int id = 0; id < n_candidates; ++id) {
        candidates.push_back({
            .id=id,
            .m_connected=std::chrono::seconds{random_context.randrange(100)},
            .m_min_ping_time=std::chrono::microseconds{random_context.randrange(100)},
            .m_last_block_time=std::chrono::seconds{random_context.randrange(100)},
            .m_last_tx_time=std::chrono::seconds{random_context.randrange(100)},
            .fRelevantServices=random_context.randbool(),
            .m_relay_txs=random_context.randbool(),
            .fBloomFilter=random_context.randbool(),
            .nKeyedNetGroup=random_context.randrange(100u),
            .prefer_evict=random_context.randbool(),
            .m_is_local=random_context.randbool(),
            .m_network=ALL_NETWORKS[random_context.randrange(ALL_NETWORKS.size())],
            .m_noban=false,
            .m_conn_type=ConnectionType::INBOUND,
        });
    }
    return candidates;
}